

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

Formula * Kernel::Formula::quantify(Formula *f)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  Formula *vs;
  SList *ss;
  Formula *in_RDI;
  TermList s;
  uint v;
  Iterator tmit;
  FIFO theirSorts;
  FIFO quantifiedVars;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> tMap;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff28;
  Term *in_stack_ffffffffffffff30;
  FIFO *in_stack_ffffffffffffff38;
  TermList in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff4c;
  Connective con;
  QuantifiedFormula *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  TermList elem;
  undefined8 in_stack_ffffffffffffff70;
  TermList in_stack_ffffffffffffff78;
  Formula *in_stack_ffffffffffffff80;
  FIFO local_60;
  FIFO local_50 [2];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_30;
  Formula *local_8;
  
  uVar1 = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  elem._content = (uint64_t)&local_30;
  local_8 = in_RDI;
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             elem._content);
  SortHelper::collectVariableSorts
            (in_stack_ffffffffffffff80,
             (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             in_stack_ffffffffffffff78._content,(bool)uVar1);
  Lib::List<unsigned_int>::FIFO::FIFO(local_50);
  Lib::List<Kernel::TermList>::FIFO::FIFO(&local_60);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::
  Iterator((Iterator *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  do {
    while( true ) {
      uVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              Iterator::hasNext((Iterator *)0x857405);
      if (!(bool)uVar1) {
        bVar3 = Lib::List<unsigned_int>::FIFO::empty(local_50);
        con = CONCAT13((char)(in_stack_ffffffffffffff4c >> 0x18),
                       CONCAT12(bVar3,(short)in_stack_ffffffffffffff4c));
        if (!bVar3) {
          vs = (Formula *)QuantifiedFormula::operator_new(0x857528);
          ss = (SList *)Lib::List<unsigned_int>::FIFO::list(local_50);
          in_stack_ffffffffffffff30 = (Term *)Lib::List<Kernel::TermList>::FIFO::list(&local_60);
          QuantifiedFormula::QuantifiedFormula
                    (in_stack_ffffffffffffff50,con,(VList *)vs,ss,
                     (Formula *)in_stack_ffffffffffffff30);
          local_8 = vs;
        }
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_ffffffffffffff30);
        return local_8;
      }
      TermList::TermList((TermList *)&stack0xffffffffffffff78);
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::
      next((Iterator *)in_stack_ffffffffffffff40._content,(uint *)in_stack_ffffffffffffff38,
           (TermList *)in_stack_ffffffffffffff30);
      uVar2 = TermList::isTerm((TermList *)0x857444);
      if ((bool)uVar2) break;
LAB_008574c8:
      Lib::List<unsigned_int>::FIFO::pushBack
                ((FIFO *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      Lib::List<Kernel::TermList>::FIFO::pushBack
                ((FIFO *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff58)),elem);
    }
    in_stack_ffffffffffffff50 = (QuantifiedFormula *)TermList::term((TermList *)0x85745e);
    bVar3 = Term::isSuper(in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff4c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff4c);
    if (!bVar3) goto LAB_008574c8;
    Lib::List<unsigned_int>::FIFO::pushFront
              ((FIFO *)in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    Lib::List<Kernel::TermList>::FIFO::pushFront
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  } while( true );
}

Assistant:

Formula* Formula::quantify(Formula* f)
{

  DHMap<unsigned,TermList> tMap;
  SortHelper::collectVariableSorts(f,tMap,/*ignoreBound=*/true);

  //we have to quantify the formula
  VList::FIFO quantifiedVars;
  SList::FIFO theirSorts;

  DHMap<unsigned,TermList>::Iterator tmit(tMap);
  while(tmit.hasNext()) {
    unsigned v;
    TermList s;
    tmit.next(v, s);
    if(s.isTerm() && s.term()->isSuper()){
      // type variable must appear at the start of the list
      quantifiedVars.pushFront(v);
      theirSorts.pushFront(s);
    } else {
      quantifiedVars.pushBack(v);
      theirSorts.pushBack(s);
    }
  }
  if(!quantifiedVars.empty()) {
    f = new QuantifiedFormula(FORALL, quantifiedVars.list(), theirSorts.list(), f);
  }
  return f;
}